

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete_cosine_transform.cc
# Opt level: O0

bool __thiscall
sptk::DiscreteCosineTransform::Run
          (DiscreteCosineTransform *this,vector<double,_std::allocator<double>_> *real_part_input,
          vector<double,_std::allocator<double>_> *imag_part_input,
          vector<double,_std::allocator<double>_> *real_part_output,
          vector<double,_std::allocator<double>_> *imag_part_output,Buffer *buffer)

{
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> __first_00;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> in_RDI;
  vector<double,_std::allocator<double>_> *in_R8;
  long in_R9;
  int i;
  double *sine_table;
  double *cosine_table;
  double *fourier_transform_imag_part;
  double *fourier_transform_real_part;
  double *discrete_cosine_transform_imag_part_output;
  double *discrete_cosine_transform_real_part_output;
  int dft_length;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff08;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff10;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff18;
  bool local_1;
  
  bVar1 = FourierTransform::IsValid((FourierTransform *)0x10eded);
  if ((((bVar1) &&
       (sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
       sVar3 == (long)*(int *)(in_RDI._M_current + 1))) &&
      (sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RDX),
      sVar3 == (long)*(int *)(in_RDI._M_current + 1))) &&
     (((in_RCX != (vector<double,_std::allocator<double>_> *)0x0 &&
       (in_R8 != (vector<double,_std::allocator<double>_> *)0x0)) && (in_R9 != 0)))) {
    iVar2 = FourierTransform::GetLength((FourierTransform *)0x10ee68);
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_R9 + 8));
    if (sVar3 != (long)iVar2) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff10._M_current,
                 (size_type)in_stack_ffffffffffffff08._M_current);
    }
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_R9 + 0x20));
    if (sVar3 != (long)iVar2) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff10._M_current,
                 (size_type)in_stack_ffffffffffffff08._M_current);
    }
    sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RCX);
    if (sVar3 != (long)*(int *)(in_RDI._M_current + 1)) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff10._M_current,
                 (size_type)in_stack_ffffffffffffff08._M_current);
    }
    sVar3 = std::vector<double,_std::allocator<double>_>::size(in_R8);
    if (sVar3 != (long)*(int *)(in_RDI._M_current + 1)) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff10._M_current,
                 (size_type)in_stack_ffffffffffffff08._M_current);
    }
    std::vector<double,_std::allocator<double>_>::begin
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffee8._M_current);
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffee8._M_current);
    std::vector<double,_std::allocator<double>_>::begin
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffee8._M_current);
    std::
    copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    std::vector<double,_std::allocator<double>_>::begin
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffee8._M_current);
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffee8._M_current);
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffee8._M_current);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator-
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
               (difference_type)in_RDI._M_current);
    __first._M_current._4_4_ = in_stack_fffffffffffffefc;
    __first._M_current._0_4_ = in_stack_fffffffffffffef8;
    std::
    reverse_copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (__first,in_RDI,in_stack_fffffffffffffee8);
    std::vector<double,_std::allocator<double>_>::begin
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffee8._M_current);
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffee8._M_current);
    std::vector<double,_std::allocator<double>_>::begin
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffee8._M_current);
    std::
    copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    std::vector<double,_std::allocator<double>_>::begin
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffee8._M_current);
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffee8._M_current);
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffee8._M_current);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator-
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
               (difference_type)in_RDI._M_current);
    __first_00._M_current._4_4_ = in_stack_fffffffffffffefc;
    __first_00._M_current._0_4_ = in_stack_fffffffffffffef8;
    std::
    reverse_copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (__first_00,in_RDI,in_stack_fffffffffffffee8);
    bVar1 = FourierTransform::Run
                      ((FourierTransform *)in_RDI._M_current,
                       (vector<double,_std::allocator<double>_> *)
                       in_stack_fffffffffffffee8._M_current,
                       (vector<double,_std::allocator<double>_> *)0x10f123);
    if (bVar1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,0);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_R8,0);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_R9 + 8),0);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_R9 + 0x20),0);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          ((long)in_RDI._M_current + 0x20),0);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &((FourierTransform *)((long)in_RDI._M_current + 0x30))->
                           fourier_transform_,0);
      for (iVar2 = 0; iVar2 < *(int *)&((FourierTransform *)in_RDI._M_current)->fourier_transform_;
          iVar2 = iVar2 + 1) {
        pvVar4[iVar2] = pvVar6[iVar2] * pvVar8[iVar2] + -(pvVar7[iVar2] * pvVar9[iVar2]);
        pvVar5[iVar2] = pvVar6[iVar2] * pvVar9[iVar2] + pvVar7[iVar2] * pvVar8[iVar2];
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool DiscreteCosineTransform::Run(
    const std::vector<double>& real_part_input,
    const std::vector<double>& imag_part_input,
    std::vector<double>* real_part_output,
    std::vector<double>* imag_part_output,
    DiscreteCosineTransform::Buffer* buffer) const {
  // Check inputs.
  if (!fourier_transform_.IsValid() ||
      real_part_input.size() != static_cast<std::size_t>(dct_length_) ||
      imag_part_input.size() != static_cast<std::size_t>(dct_length_) ||
      NULL == real_part_output || NULL == imag_part_output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int dft_length(fourier_transform_.GetLength());
  if (buffer->fourier_transform_real_part_.size() !=
      static_cast<std::size_t>(dft_length)) {
    buffer->fourier_transform_real_part_.resize(dft_length);
  }
  if (buffer->fourier_transform_imag_part_.size() !=
      static_cast<std::size_t>(dft_length)) {
    buffer->fourier_transform_imag_part_.resize(dft_length);
  }
  if (real_part_output->size() != static_cast<std::size_t>(dct_length_)) {
    real_part_output->resize(dct_length_);
  }
  if (imag_part_output->size() != static_cast<std::size_t>(dct_length_)) {
    imag_part_output->resize(dct_length_);
  }

  std::copy(real_part_input.begin(), real_part_input.end(),
            buffer->fourier_transform_real_part_.begin());
  std::reverse_copy(real_part_input.begin(), real_part_input.end(),
                    buffer->fourier_transform_real_part_.end() - dct_length_);

  std::copy(imag_part_input.begin(), imag_part_input.end(),
            buffer->fourier_transform_imag_part_.begin());
  std::reverse_copy(imag_part_input.begin(), imag_part_input.end(),
                    buffer->fourier_transform_imag_part_.end() - dct_length_);

  if (!fourier_transform_.Run(&buffer->fourier_transform_real_part_,
                              &buffer->fourier_transform_imag_part_)) {
    return false;
  }

  double* discrete_cosine_transform_real_part_output(&((*real_part_output)[0]));
  double* discrete_cosine_transform_imag_part_output(&((*imag_part_output)[0]));
  const double* fourier_transform_real_part(
      &buffer->fourier_transform_real_part_[0]);
  const double* fourier_transform_imag_part(
      &buffer->fourier_transform_imag_part_[0]);
  const double* cosine_table(&(cosine_table_[0]));
  const double* sine_table(&(sine_table_[0]));

  for (int i(0); i < dct_length_; ++i) {
    discrete_cosine_transform_real_part_output[i] =
        fourier_transform_real_part[i] * cosine_table[i] -
        fourier_transform_imag_part[i] * sine_table[i];
    discrete_cosine_transform_imag_part_output[i] =
        fourier_transform_real_part[i] * sine_table[i] +
        fourier_transform_imag_part[i] * cosine_table[i];
  }

  return true;
}